

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O0

bool __thiscall cmComputeLinkInformation::Compute(cmComputeLinkInformation *this)

{
  cmGeneratorTarget *this_00;
  cmake *this_01;
  bool bVar1;
  TargetType TVar2;
  ulong uVar3;
  string *__rhs;
  vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_> *this_02
  ;
  char *val;
  set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
  *this_03;
  reference ppcVar4;
  ostream *poVar5;
  PolicyID id;
  bool local_5a1;
  undefined1 local_558 [16];
  string local_548;
  string local_528;
  string local_508;
  undefined1 local_4e8 [8];
  ostringstream w;
  string local_368;
  ArtifactType local_348;
  bool local_341;
  ArtifactType artifact;
  bool implib;
  cmGeneratorTarget *tgt;
  iterator __end2;
  iterator __begin2;
  set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
  *__range2;
  set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
  *wrongItems;
  string local_310;
  char *local_2f0;
  char *lss;
  LinkEntry *linkEntry;
  const_iterator __end1;
  const_iterator __begin1;
  EntryVector *__range1;
  EntryVector *linkEntries;
  cmComputeLinkDepends cld;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  cmComputeLinkInformation *local_18;
  cmComputeLinkInformation *this_local;
  
  local_18 = this;
  TVar2 = cmGeneratorTarget::GetType(this->Target);
  if ((((TVar2 == EXECUTABLE) ||
       (TVar2 = cmGeneratorTarget::GetType(this->Target), TVar2 == SHARED_LIBRARY)) ||
      (TVar2 = cmGeneratorTarget::GetType(this->Target), TVar2 == MODULE_LIBRARY)) ||
     (TVar2 = cmGeneratorTarget::GetType(this->Target), TVar2 == STATIC_LIBRARY)) {
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      cmComputeLinkDepends::cmComputeLinkDepends
                ((cmComputeLinkDepends *)&linkEntries,this->Target,&this->Config);
      cmComputeLinkDepends::SetOldLinkDirMode
                ((cmComputeLinkDepends *)&linkEntries,(bool)(this->OldLinkDirMode & 1));
      this_02 = cmComputeLinkDepends::Compute((cmComputeLinkDepends *)&linkEntries);
      __end1 = std::
               vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
               ::begin(this_02);
      linkEntry = (LinkEntry *)
                  std::
                  vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
                  ::end(this_02);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end1,(__normal_iterator<const_cmComputeLinkDepends::LinkEntry_*,_std::vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>_>
                                         *)&linkEntry), bVar1) {
        lss = (char *)__gnu_cxx::
                      __normal_iterator<const_cmComputeLinkDepends::LinkEntry_*,_std::vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>_>
                      ::operator*(&__end1);
        if ((((reference)lss)->IsSharedDep & 1U) == 0) {
          AddItem(this,(string *)lss,((reference)lss)->Target);
        }
        else {
          AddSharedDepItem(this,(string *)lss,((reference)lss)->Target);
        }
        __gnu_cxx::
        __normal_iterator<const_cmComputeLinkDepends::LinkEntry_*,_std::vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>_>
        ::operator++(&__end1);
      }
      this_00 = this->Target;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_310,"LINK_SEARCH_END_STATIC",
                 (allocator<char> *)((long)&wrongItems + 7));
      val = cmGeneratorTarget::GetProperty(this_00,&local_310);
      std::__cxx11::string::~string((string *)&local_310);
      std::allocator<char>::~allocator((allocator<char> *)((long)&wrongItems + 7));
      local_2f0 = val;
      bVar1 = cmSystemTools::IsOn(val);
      if (bVar1) {
        SetCurrentLinkType(this,LinkStatic);
      }
      else {
        SetCurrentLinkType(this,this->StartLinkType);
      }
      if ((this->OldLinkDirMode & 1U) != 0) {
        this_03 = cmComputeLinkDepends::GetOldWrongConfigItems((cmComputeLinkDepends *)&linkEntries)
        ;
        __end2 = std::
                 set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
                 ::begin(this_03);
        tgt = (cmGeneratorTarget *)
              std::
              set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
              ::end(this_03);
        while (bVar1 = std::operator!=(&__end2,(_Self *)&tgt), bVar1) {
          ppcVar4 = std::_Rb_tree_const_iterator<const_cmGeneratorTarget_*>::operator*(&__end2);
          _artifact = *ppcVar4;
          local_5a1 = false;
          if ((this->UseImportLibrary & 1U) != 0) {
            TVar2 = cmGeneratorTarget::GetType(_artifact);
            local_5a1 = TVar2 == SHARED_LIBRARY;
          }
          local_341 = local_5a1;
          local_348 = (ArtifactType)local_5a1;
          cmGeneratorTarget::GetFullPath(&local_368,_artifact,&this->Config,local_348,true);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&this->OldLinkDirItems,&local_368);
          std::__cxx11::string::~string((string *)&local_368);
          std::_Rb_tree_const_iterator<const_cmGeneratorTarget_*>::operator++(&__end2);
        }
      }
      bVar1 = FinishLinkerSearchDirectories(this);
      if (bVar1) {
        AddImplicitLinkInfo(this);
        bVar1 = std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::empty(&this->CMP0060WarnItems);
        if (!bVar1) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4e8);
          cmPolicies::GetPolicyWarning_abi_cxx11_(&local_508,(cmPolicies *)0x3c,id);
          poVar5 = std::operator<<((ostream *)local_4e8,(string *)&local_508);
          poVar5 = std::operator<<(poVar5,
                                   "\nSome library files are in directories implicitly searched by the linker when invoked for "
                                  );
          poVar5 = std::operator<<(poVar5,(string *)&this->LinkLanguage);
          poVar5 = std::operator<<(poVar5,":\n ");
          cmJoin<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
                    (&local_528,&this->CMP0060WarnItems,"\n ");
          poVar5 = std::operator<<(poVar5,(string *)&local_528);
          std::operator<<(poVar5,
                          "\nFor compatibility with older versions of CMake, the generated link line will ask the linker to search for these by library name."
                         );
          std::__cxx11::string::~string((string *)&local_528);
          std::__cxx11::string::~string((string *)&local_508);
          this_01 = this->CMakeInstance;
          std::__cxx11::ostringstream::str();
          cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_558);
          cmake::IssueMessage(this_01,AUTHOR_WARNING,(string *)(local_558 + 0x10),
                              (cmListFileBacktrace *)local_558);
          cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_558);
          std::__cxx11::string::~string((string *)(local_558 + 0x10));
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4e8);
        }
        this_local._7_1_ = 1;
      }
      else {
        this_local._7_1_ = 0;
      }
      cmComputeLinkDepends::~cmComputeLinkDepends((cmComputeLinkDepends *)&linkEntries);
    }
    else {
      __rhs = cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
      std::operator+(&local_38,"CMake can not determine linker language for target: ",__rhs);
      cmSystemTools::Error(&local_38);
      std::__cxx11::string::~string((string *)&local_38);
      this_local._7_1_ = 0;
    }
  }
  else {
    this_local._7_1_ = 0;
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmComputeLinkInformation::Compute()
{
  // Skip targets that do not link.
  if (!(this->Target->GetType() == cmStateEnums::EXECUTABLE ||
        this->Target->GetType() == cmStateEnums::SHARED_LIBRARY ||
        this->Target->GetType() == cmStateEnums::MODULE_LIBRARY ||
        this->Target->GetType() == cmStateEnums::STATIC_LIBRARY)) {
    return false;
  }

  // We require a link language for the target.
  if (this->LinkLanguage.empty()) {
    cmSystemTools::Error(
      "CMake can not determine linker language for target: " +
      this->Target->GetName());
    return false;
  }

  // Compute the ordered link line items.
  cmComputeLinkDepends cld(this->Target, this->Config);
  cld.SetOldLinkDirMode(this->OldLinkDirMode);
  cmComputeLinkDepends::EntryVector const& linkEntries = cld.Compute();

  // Add the link line items.
  for (cmComputeLinkDepends::LinkEntry const& linkEntry : linkEntries) {
    if (linkEntry.IsSharedDep) {
      this->AddSharedDepItem(linkEntry.Item, linkEntry.Target);
    } else {
      this->AddItem(linkEntry.Item, linkEntry.Target);
    }
  }

  // Restore the target link type so the correct system runtime
  // libraries are found.
  const char* lss = this->Target->GetProperty("LINK_SEARCH_END_STATIC");
  if (cmSystemTools::IsOn(lss)) {
    this->SetCurrentLinkType(LinkStatic);
  } else {
    this->SetCurrentLinkType(this->StartLinkType);
  }

  // Finish listing compatibility paths.
  if (this->OldLinkDirMode) {
    // For CMake 2.4 bug-compatibility we need to consider the output
    // directories of targets linked in another configuration as link
    // directories.
    std::set<cmGeneratorTarget const*> const& wrongItems =
      cld.GetOldWrongConfigItems();
    for (cmGeneratorTarget const* tgt : wrongItems) {
      bool implib = (this->UseImportLibrary &&
                     (tgt->GetType() == cmStateEnums::SHARED_LIBRARY));
      cmStateEnums::ArtifactType artifact = implib
        ? cmStateEnums::ImportLibraryArtifact
        : cmStateEnums::RuntimeBinaryArtifact;
      this->OldLinkDirItems.push_back(
        tgt->GetFullPath(this->Config, artifact, true));
    }
  }

  // Finish setting up linker search directories.
  if (!this->FinishLinkerSearchDirectories()) {
    return false;
  }

  // Add implicit language runtime libraries and directories.
  this->AddImplicitLinkInfo();

  if (!this->CMP0060WarnItems.empty()) {
    std::ostringstream w;
    /* clang-format off */
    w << cmPolicies::GetPolicyWarning(cmPolicies::CMP0060) << "\n"
      "Some library files are in directories implicitly searched by "
      "the linker when invoked for " << this->LinkLanguage << ":\n"
      " " << cmJoin(this->CMP0060WarnItems, "\n ") << "\n"
      "For compatibility with older versions of CMake, the generated "
      "link line will ask the linker to search for these by library "
      "name."
      ;
    /* clang-format on */
    this->CMakeInstance->IssueMessage(MessageType::AUTHOR_WARNING, w.str(),
                                      this->Target->GetBacktrace());
  }

  return true;
}